

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_rshift(mp_ptr rp,mp_srcptr up,mp_size_t n,uint cnt)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  mp_limb_t retval;
  ulong uStack_38;
  uint tnc;
  mp_limb_t low_limb;
  mp_limb_t high_limb;
  mp_size_t mStack_20;
  uint cnt_local;
  mp_size_t n_local;
  mp_srcptr up_local;
  mp_ptr rp_local;
  
  if (n < 1) {
    __assert_fail("n >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x286,"mp_limb_t mpn_rshift(mp_ptr, mp_srcptr, mp_size_t, unsigned int)");
  }
  if (cnt != 0) {
    if (cnt < 0x40) {
      bVar3 = (byte)cnt;
      uVar1 = *up;
      uStack_38 = uVar1 >> (bVar3 & 0x3f);
      mStack_20 = n;
      n_local = (mp_size_t)(up + 1);
      up_local = rp;
      while (mStack_20 = mStack_20 + -1, mStack_20 != 0) {
        uVar2 = *(ulong *)n_local;
        *up_local = uStack_38 | uVar2 << (0x40 - bVar3 & 0x3f);
        uStack_38 = uVar2 >> (bVar3 & 0x3f);
        n_local = n_local + 8;
        up_local = up_local + 1;
      }
      *up_local = uStack_38;
      return uVar1 << (0x40 - bVar3 & 0x3f);
    }
    __assert_fail("cnt < GMP_LIMB_BITS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                  ,0x288,"mp_limb_t mpn_rshift(mp_ptr, mp_srcptr, mp_size_t, unsigned int)");
  }
  __assert_fail("cnt >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x287,"mp_limb_t mpn_rshift(mp_ptr, mp_srcptr, mp_size_t, unsigned int)");
}

Assistant:

mp_limb_t
mpn_rshift (mp_ptr rp, mp_srcptr up, mp_size_t n, unsigned int cnt)
{
  mp_limb_t high_limb, low_limb;
  unsigned int tnc;
  mp_limb_t retval;

  assert (n >= 1);
  assert (cnt >= 1);
  assert (cnt < GMP_LIMB_BITS);

  tnc = GMP_LIMB_BITS - cnt;
  high_limb = *up++;
  retval = (high_limb << tnc);
  low_limb = high_limb >> cnt;

  while (--n != 0)
    {
      high_limb = *up++;
      *rp++ = low_limb | (high_limb << tnc);
      low_limb = high_limb >> cnt;
    }
  *rp = low_limb;

  return retval;
}